

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineColorBlendStateCreateInfo>
          (Impl *this,VkPipelineColorBlendStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineColorBlendStateCreateInfo *pVVar1;
  void *pvVar2;
  VkPipelineColorBlendAttachmentState *pVVar3;
  undefined8 uVar4;
  VkPipelineColorBlendStateCreateFlags VVar5;
  VkBool32 VVar6;
  VkLogicOp VVar7;
  uint32_t uVar8;
  VkStructureType VVar9;
  undefined4 uVar10;
  bool bVar11;
  VkPipelineColorBlendStateCreateInfo *pVVar12;
  bool bVar13;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar13 = true;
  if (pVVar1 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
    pVVar12 = (VkPipelineColorBlendStateCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x38,0x10)
    ;
    if (pVVar12 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
      VVar9 = pVVar1->sType;
      uVar10 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      VVar5 = pVVar1->flags;
      VVar6 = pVVar1->logicOpEnable;
      VVar7 = pVVar1->logicOp;
      uVar8 = pVVar1->attachmentCount;
      pVVar3 = pVVar1->pAttachments;
      uVar4 = *(undefined8 *)pVVar1->blendConstants;
      *(undefined8 *)(pVVar12->blendConstants + 2) = *(undefined8 *)(pVVar1->blendConstants + 2);
      pVVar12->pAttachments = pVVar3;
      *(undefined8 *)pVVar12->blendConstants = uVar4;
      pVVar12->flags = VVar5;
      pVVar12->logicOpEnable = VVar6;
      pVVar12->logicOp = VVar7;
      pVVar12->attachmentCount = uVar8;
      pVVar12->sType = VVar9;
      *(undefined4 *)&pVVar12->field_0x4 = uVar10;
      pVVar12->pNext = pvVar2;
    }
    *sub_info = pVVar12;
    local_38 = (void *)0x0;
    bVar11 = copy_pnext_chain(this,pVVar12->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar11) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar13 = false;
    }
  }
  return bVar13;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}